

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::UntypedMessage::Decode64Bit
          (UntypedMessage *this,CodedInputStream *stream,Field *field)

{
  bool bVar1;
  double *in_RCX;
  uint64_t x;
  size_type local_48;
  int local_30;
  Field_Kind local_2c;
  FormatSpec<google::protobuf::Field_Kind,_int> local_28;
  
  local_2c = *(Field_Kind *)((long)in_RCX[1] + 0x48);
  if (local_2c == Field_Kind_TYPE_DOUBLE) {
    bVar1 = io::CodedInputStream::ReadLittleEndian64((CodedInputStream *)field,&x);
    if (!bVar1) goto LAB_002a4803;
    local_28.super_type.spec_.data_ = (void *)x;
    InsertField<double>(this,(Field *)stream,in_RCX);
  }
  else if (local_2c == Field_Kind_TYPE_SFIXED64) {
    bVar1 = io::CodedInputStream::ReadLittleEndian64((CodedInputStream *)field,&x);
    if (!bVar1) goto LAB_002a4803;
    local_28.super_type.spec_.data_ = (void *)x;
    InsertField<long>(this,(Field *)stream,(long *)in_RCX);
  }
  else {
    if (local_2c != Field_Kind_TYPE_FIXED64) {
      local_28.super_type.spec_.data_ =
           "field type %d (number %d) does not support type 64-bit fields";
      local_28.super_type.spec_.size_ = 0x3d;
      local_30 = *(int *)((long)in_RCX[1] + 0x50);
      absl::lts_20240722::StrFormat<google::protobuf::Field_Kind,_int>
                ((string *)&x,&local_28,&local_2c,&local_30);
      absl::lts_20240722::InvalidArgumentError(this,local_48,x);
      std::__cxx11::string::~string((string *)&x);
      return (Status)(uintptr_t)this;
    }
    bVar1 = io::CodedInputStream::ReadLittleEndian64((CodedInputStream *)field,&x);
    if (!bVar1) {
LAB_002a4803:
      absl::lts_20240722::InvalidArgumentError(this,0xe,"unexpected EOF");
      return (Status)(uintptr_t)this;
    }
    InsertField<unsigned_long&>(this,(Field *)stream,(unsigned_long *)in_RCX);
  }
  if (this->desc_ == (Message *)0x1) {
    absl::lts_20240722::Status::~Status((Status *)this);
    this->desc_ = (Message *)0x1;
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status UntypedMessage::Decode64Bit(io::CodedInputStream& stream,
                                         const ResolverPool::Field& field) {
  switch (field.proto().kind()) {
    case Field::TYPE_FIXED64: {
      uint64_t x;
      if (!stream.ReadLittleEndian64(&x)) {
        return absl::InvalidArgumentError("unexpected EOF");
      }
      RETURN_IF_ERROR(InsertField(field, x));
      break;
    }
    case Field::TYPE_SFIXED64: {
      uint64_t x;
      if (!stream.ReadLittleEndian64(&x)) {
        return absl::InvalidArgumentError("unexpected EOF");
      }
      RETURN_IF_ERROR(InsertField(field, static_cast<int64_t>(x)));
      break;
    }
    case Field::TYPE_DOUBLE: {
      uint64_t x;
      if (!stream.ReadLittleEndian64(&x)) {
        return absl::InvalidArgumentError("unexpected EOF");
      }
      RETURN_IF_ERROR(InsertField(field, absl::bit_cast<double>(x)));
      break;
    }
    default:
      return absl::InvalidArgumentError(
          absl::StrFormat("field type %d (number %d) does not support "
                          "type 64-bit fields",
                          field.proto().kind(), field.proto().number()));
  }
  return absl::OkStatus();
}